

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::IdleDecommitPageAllocator::DecommitNow(IdleDecommitPageAllocator *this,bool all)

{
  uint uVar1;
  undefined4 *puVar2;
  code *pcVar3;
  undefined8 *in_FS_OFFSET;
  bool bVar4;
  
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::SuspendIdleDecommit(&this->super_PageAllocator);
  bVar4 = (this->super_PageAllocator).maxFreePageCount == this->maxNonIdleDecommitFreePageCount;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::DecommitNow(&this->super_PageAllocator,bVar4 || all);
  if (bVar4 || all) {
    uVar1 = (this->super_PageAllocator).idleDecommitEnterCount;
    if (this->hasDecommitTimer == true) {
      if (uVar1 != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar2 = (undefined4 *)*in_FS_OFFSET;
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0xcc,"(idleDecommitEnterCount == 0)","idleDecommitEnterCount == 0");
        if (!bVar4) goto LAB_00265be3;
        *puVar2 = 0;
      }
      if ((this->super_PageAllocator).maxFreePageCount != this->maxIdleDecommitFreePageCount) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar2 = (undefined4 *)*in_FS_OFFSET;
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                           ,0xcd,"(this->maxFreePageCount == maxIdleDecommitFreePageCount)",
                           "this->maxFreePageCount == maxIdleDecommitFreePageCount");
        if (!bVar4) {
LAB_00265be3:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar2 = 0;
      }
      this->hasDecommitTimer = false;
      (this->super_PageAllocator).maxFreePageCount = this->maxNonIdleDecommitFreePageCount;
    }
    else if (*(uint *)((this->cs).super_CCLock.mutexPtr + (ulong)(uVar1 == 0) * 4 + -0x18) !=
             (this->super_PageAllocator).maxFreePageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                         ,0xd4,
                         "((idleDecommitEnterCount > 0? maxIdleDecommitFreePageCount : maxNonIdleDecommitFreePageCount) == this->maxFreePageCount)"
                         ,
                         "(idleDecommitEnterCount > 0? maxIdleDecommitFreePageCount : maxNonIdleDecommitFreePageCount) == this->maxFreePageCount"
                        );
      if (!bVar4) goto LAB_00265be3;
      *puVar2 = 0;
    }
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ClearMinFreePageCount(&this->super_PageAllocator);
  }
  else {
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ResetMinFreePageCount(&this->super_PageAllocator);
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::ResumeIdleDecommit(&this->super_PageAllocator);
  return;
}

Assistant:

void
IdleDecommitPageAllocator::DecommitNow(bool all)
{
    SuspendIdleDecommit();

    // If we are in non-idle-decommit mode, then always decommit all.
    // Otherwise, we will end up with some un-decommitted pages and get confused later.
    if (maxFreePageCount == maxNonIdleDecommitFreePageCount)
        all = true;

    __super::DecommitNow(all);

    if (all)
    {
        if (this->hasDecommitTimer)
        {
            Assert(idleDecommitEnterCount == 0);
            Assert(this->maxFreePageCount == maxIdleDecommitFreePageCount);
            this->hasDecommitTimer = false;
            this->maxFreePageCount = maxNonIdleDecommitFreePageCount;
        }
        else
        {
            Assert((idleDecommitEnterCount > 0? maxIdleDecommitFreePageCount : maxNonIdleDecommitFreePageCount)
                == this->maxFreePageCount);
        }
        ClearMinFreePageCount();
    }
    else
    {
        ResetMinFreePageCount();
    }

    ResumeIdleDecommit();
}